

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix_address.h
# Opt level: O2

string * __thiscall
sockpp::unix_address::path_abi_cxx11_(string *__return_storage_ptr__,unix_address *this)

{
  char *__string;
  size_t sVar1;
  
  __string = (this->addr_).sun_path;
  sVar1 = strnlen(__string,0x6c);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,__string,(this->addr_).sun_path + sVar1);
  return __return_storage_ptr__;
}

Assistant:

string path() const {
        // Remember, if len==MAX, there's no NUL terminator
        return string(addr_.sun_path, strnlen(addr_.sun_path, MAX_PATH_NAME));
    }